

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1_parser.c
# Opt level: O0

size_t http1_fio_parser_fn(http1_fio_parser_args_s *args)

{
  long lVar1;
  uint8_t *puVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  code *local_90;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  int local_38;
  byte local_31;
  int t3;
  uint8_t eol_len;
  uint8_t *stop;
  uint8_t *end;
  uint8_t *start;
  http1_fio_parser_args_s *args_local;
  
  (args->parser->state).next = (uint8_t *)0x0;
  stop = (uint8_t *)args->buffer;
  _t3 = stop + args->length;
  local_31 = 0;
  end = stop;
  start = (uint8_t *)args;
  do {
    bVar3 = *(byte *)(*(long *)start + 0x20) & 0xf;
    if ((*(byte *)(*(long *)start + 0x20) & 0xf) == 0) {
      while( true ) {
        bVar5 = false;
        if ((((end < _t3) && (bVar5 = true, *end != '\r')) && (bVar5 = true, *end != '\n')) &&
           (bVar5 = true, *end != ' ')) {
          bVar5 = *end == '\0';
        }
        if (!bVar5) break;
        end = end + 1;
      }
      stop = end;
      local_31 = seek2eol(&stop,_t3);
      if (local_31 == 0) {
        return (size_t)(end + -*(long *)(start + 8));
      }
      if (((*end == 'H') && (end[1] == 'T')) && ((end[2] == 'T' && (end[3] == 'P')))) {
        iVar4 = consume_response_line
                          ((http1_fio_parser_args_s *)start,end,
                           stop + (1 - (long)(int)(uint)local_31));
joined_r0x0018ab9b:
        if (iVar4 != 0) goto LAB_0018adc7;
      }
      else {
        iVar4 = tolower((uint)*end);
        if ((0x60 < iVar4) && (iVar4 = tolower((uint)*end), iVar4 < 0x7b)) {
          iVar4 = consume_request_line
                            ((http1_fio_parser_args_s *)start,end,
                             stop + (1 - (long)(int)(uint)local_31));
          goto joined_r0x0018ab9b;
        }
      }
      stop = stop + 1;
      *(byte *)(*(long *)start + 0x20) = *(byte *)(*(long *)start + 0x20) | 1;
      end = stop;
LAB_0018abc9:
      do {
        if (_t3 <= end) {
          return (size_t)(end + -*(long *)(start + 8));
        }
        if ((*end == '\r') || (*end == '\n')) break;
        local_31 = seek2eol(&stop,_t3);
        if (local_31 == 0) {
          return (size_t)(end + -*(long *)(start + 8));
        }
        iVar4 = consume_header((http1_fio_parser_args_s *)start,end,
                               stop + (1 - (long)(int)(uint)local_31));
        if (iVar4 != 0) goto LAB_0018adc7;
        stop = stop + 1;
        end = stop;
      } while ((*(byte *)(*(long *)start + 0x20) & 2) == 0);
      puVar2 = end + 1;
      if (end[1] == '\n') {
        puVar2 = end + 2;
      }
      end = puVar2;
      stop = end;
      *(byte *)(*(long *)start + 0x20) = *(byte *)(*(long *)start + 0x20) | 2;
    }
    else {
      if (bVar3 == 1) goto LAB_0018abc9;
      if (bVar3 != 3) goto LAB_0018acfb;
    }
    local_38 = consume_body((http1_fio_parser_args_s *)start,&end);
  } while (local_38 == -2);
  if (local_38 == -1) {
LAB_0018adc7:
    (**(code **)(start + 0x60))(*(undefined8 *)start);
    lVar1 = *(long *)start;
    memset(&local_78,0,0x20);
    *(undefined8 *)(lVar1 + 8) = local_78;
    *(undefined8 *)(lVar1 + 0x10) = local_70;
    *(undefined8 *)(lVar1 + 0x18) = local_68;
    *(undefined8 *)(lVar1 + 0x20) = local_60;
    args_local = *(http1_fio_parser_args_s **)(start + 0x10);
  }
  else {
LAB_0018acfb:
    if ((*(byte *)(*(long *)start + 0x20) & 4) != 0) {
      *(uint8_t **)(*(long *)start + 0x18) = end;
      if ((*(byte *)(*(long *)start + 0x20) & 0x80) == 0) {
        local_90 = *(code **)(start + 0x18);
      }
      else {
        local_90 = *(code **)(start + 0x20);
      }
      iVar4 = (*local_90)(*(undefined8 *)start);
      if (iVar4 != 0) goto LAB_0018adc7;
      lVar1 = *(long *)start;
      memset(&local_58,0,0x20);
      *(undefined8 *)(lVar1 + 8) = local_58;
      *(undefined8 *)(lVar1 + 0x10) = local_50;
      *(undefined8 *)(lVar1 + 0x18) = local_48;
      *(undefined8 *)(lVar1 + 0x20) = local_40;
    }
    args_local = (http1_fio_parser_args_s *)(end + -*(long *)(start + 8));
  }
  return (size_t)args_local;
}

Assistant:

size_t http1_fio_parser_fn(struct http1_fio_parser_args_s *args) {
  assert(args->parser && args->buffer);
  args->parser->state.next = NULL;
  uint8_t *start = args->buffer;
  uint8_t *end = start;
  uint8_t *const stop = start + args->length;
  uint8_t eol_len = 0;
#define CONSUMED ((size_t)((uintptr_t)start - (uintptr_t)args->buffer))
// fprintf(stderr, "** resuming with at %p with %.*s...(%lu)\n", args->buffer,
// 4,
//         start, args->length);
re_eval:
  switch ((args->parser->state.reserved & 15)) {

  /* request / response line */
  case 0:
    /* clear out any leadinng white space */
    while ((start < stop) &&
           (*start == '\r' || *start == '\n' || *start == ' ' || *start == 0)) {
      ++start;
    }
    end = start;
    /* make sure the whole line is available*/
    if (!(eol_len = seek2eol(&end, stop)))
      return CONSUMED;

    if (start[0] == 'H' && start[1] == 'T' && start[2] == 'T' &&
        start[3] == 'P') {
      /* HTTP response */
      if (consume_response_line(args, start, end - eol_len + 1))
        goto error;
    } else if (tolower(start[0]) >= 'a' && tolower(start[0]) <= 'z') {
      /* HTTP request */
      if (consume_request_line(args, start, end - eol_len + 1))
        goto error;
    }
    end = start = end + 1;
    args->parser->state.reserved |= 1;

  /* fallthrough */
  /* headers */
  case 1:
    do {
      if (start >= stop)
        return CONSUMED; /* buffer ended on header line */
      if (*start == '\r' || *start == '\n') {
        goto finished_headers; /* empty line, end of headers */
      }
      if (!(eol_len = seek2eol(&end, stop)))
        return CONSUMED;
      if (consume_header(args, start, end - eol_len + 1))
        goto error;
      end = start = end + 1;
    } while ((args->parser->state.reserved & 2) == 0);
  finished_headers:
    ++start;
    if (*start == '\n')
      ++start;
    end = start;
    args->parser->state.reserved |= 2;
  /* fallthrough */
  /* request body */
  case 3: { /*  2 | 1 == 3 */
    int t3 = consume_body(args, &start);
    switch (t3) {
    case -1:
      goto error;
    case -2:
      goto re_eval;
    }
    break;
  }
  }
  /* are we done ? */
  if (args->parser->state.reserved & 4) {
    args->parser->state.next = start;
    if (((args->parser->state.reserved & 128) ? args->on_response
                                              : args->on_request)(args->parser))
      goto error;
    args->parser->state =
        (struct http1_parser_protected_read_only_state_s){0, 0, 0};
  }
  return CONSUMED;
error:
  args->on_error(args->parser);
  args->parser->state =
      (struct http1_parser_protected_read_only_state_s){0, 0, 0};
  return args->length;
}